

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::loadModel(FastText *this,istream *in)

{
  shared_ptr<fasttext::Matrix> *this_00;
  shared_ptr<fasttext::QMatrix> *this_01;
  shared_ptr<fasttext::Dictionary> *this_02;
  element_type *peVar1;
  Model *pMVar2;
  invalid_argument *this_03;
  shared_ptr<fasttext::Matrix> *__args_1;
  bool quant_input;
  _Vector_base<long,_std::allocator<long>_> local_88;
  shared_ptr<fasttext::Matrix> *local_70;
  __shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2> *local_68;
  shared_ptr<fasttext::Matrix> *local_60;
  undefined4 local_54;
  __shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::make_shared<fasttext::Args>();
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_88._M_impl.super__Vector_impl_data._M_finish);
  std::make_shared<fasttext::Matrix>();
  local_70 = &this->input_;
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_70->super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_88._M_impl.super__Vector_impl_data._M_finish);
  std::make_shared<fasttext::Matrix>();
  local_60 = &this->weights_;
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_60->super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_88._M_impl.super__Vector_impl_data._M_finish);
  std::make_shared<fasttext::Matrix>();
  this_00 = &this->output_;
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_88._M_impl.super__Vector_impl_data._M_finish);
  std::make_shared<fasttext::QMatrix>();
  local_68 = &(this->qinput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>::operator=
            (local_68,(__shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_88._M_impl.super__Vector_impl_data._M_finish);
  std::make_shared<fasttext::QMatrix>();
  this_01 = &this->qoutput_;
  std::__shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_01->super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_88._M_impl.super__Vector_impl_data._M_finish);
  Args::load((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr,in)
  ;
  if ((this->version == 0xb) &&
     (peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1->model == sup)) {
    peVar1->maxn = 0;
  }
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&,std::istream&>
            ((shared_ptr<fasttext::Args> *)&local_88,
             (basic_istream<char,_std::char_traits<char>_> *)this);
  this_02 = &this->dict_;
  std::__shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_02->super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_88._M_impl.super__Vector_impl_data._M_finish);
  std::istream::read((char *)in,(long)&quant_input);
  __args_1 = local_70;
  if (quant_input == true) {
    this->quant_ = true;
    QMatrix::load((this->qinput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,in);
    __args_1 = local_70;
  }
  else {
    Matrix::load((local_70->super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 ,in);
  }
  if ((quant_input == false) &&
     (-1 < ((this_02->super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
           ->pruneidx_size_)) {
    this_03 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_03,
               "Invalid model file.\nPlease download the updated model from www.fasttext.cc.\nSee issue #332 on Github for more information.\n"
              );
    __cxa_throw(this_03,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::istream::read((char *)in,
                     (long)&((this->args_).
                             super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->qout);
  if ((this->quant_ == true) &&
     (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qout ==
      true)) {
    QMatrix::load((this_01->super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr,in);
  }
  else {
    Matrix::load((this_00->super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 in);
  }
  local_54 = 0;
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
            ((shared_ptr<fasttext::Matrix> *)&local_88,__args_1,this_00,
             (shared_ptr<fasttext::Args> *)local_60,(int *)this);
  std::__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_88._M_impl.super__Vector_impl_data._M_finish);
  pMVar2 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pMVar2->quant_ = this->quant_;
  std::__shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,local_68)
  ;
  std::__shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&this_01->super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>);
  Model::setQuantizePointer
            (pMVar2,(shared_ptr<fasttext::QMatrix> *)&local_40,
             (shared_ptr<fasttext::QMatrix> *)&local_50,
             ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             qout);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  pMVar2 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
      == sup) {
    Dictionary::getCounts
              ((vector<long,_std::allocator<long>_> *)&local_88,
               (this_02->super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,label);
    Model::setTargetCounts(pMVar2,(vector<long,_std::allocator<long>_> *)&local_88);
  }
  else {
    Dictionary::getCounts
              ((vector<long,_std::allocator<long>_> *)&local_88,
               (this_02->super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,word);
    Model::setTargetCounts(pMVar2,(vector<long,_std::allocator<long>_> *)&local_88);
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void FastText::loadModel(std::istream& in) {
	args_ = std::make_shared<Args>();
	input_ = std::make_shared<Matrix>();
	weights_ = std::make_shared<Matrix>();
	output_ = std::make_shared<Matrix>();
	qinput_ = std::make_shared<QMatrix>();
	qoutput_ = std::make_shared<QMatrix>();
	args_->load(in);
	if (version == 11 && args_->model == model_name::sup) {
		// backward compatibility: old supervised models do not use char ngrams.
		args_->maxn = 0;
	}
	dict_ = std::make_shared<Dictionary>(args_, in);

	bool quant_input;
	in.read((char*)&quant_input, sizeof(bool));
	if (quant_input) {
		quant_ = true;
		qinput_->load(in);
	} else {
		input_->load(in);
	}

	if (!quant_input && dict_->isPruned()) {
		throw std::invalid_argument(
				"Invalid model file.\n"
				"Please download the updated model from www.fasttext.cc.\n"
				"See issue #332 on Github for more information.\n");
	}

	in.read((char*)&args_->qout, sizeof(bool));
	if (quant_ && args_->qout) {
		qoutput_->load(in);
	} else {
		output_->load(in);
	}

	model_ = std::make_shared<Model>(input_, output_, weights_, args_, 0);
	model_->quant_ = quant_;
	model_->setQuantizePointer(qinput_, qoutput_, args_->qout);

	if (args_->model == model_name::sup) {
		model_->setTargetCounts(dict_->getCounts(entry_type::label));
	} else {
		model_->setTargetCounts(dict_->getCounts(entry_type::word));
	}
}